

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O1

int ecx_readODdescription(ecx_contextt *context,uint16 Item,ec_ODlistt *pODlist)

{
  ushort slave;
  uint8 uVar1;
  int iVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  ec_errort local_854;
  int local_838;
  byte local_833;
  byte local_830;
  undefined4 local_82c;
  uint8 local_828;
  uint8 local_827;
  char local_826 [1006];
  uint8 local_438 [5];
  byte local_433;
  uint8 local_432 [6];
  uint16 local_42c;
  
  slave = pODlist->Slave;
  uVar4 = CONCAT62(in_register_00000032,Item) & 0xffffffff;
  pODlist->DataType[uVar4] = 0;
  pODlist->ObjectCode[uVar4] = '\0';
  pODlist->MaxSub[uVar4] = '\0';
  pODlist->Name[uVar4][0] = '\0';
  ec_clearmbx((ec_mbxbuft *)&local_838);
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)&local_838,0);
  ec_clearmbx((ec_mbxbuft *)local_438);
  local_438[0] = '\b';
  local_438[1] = '\0';
  local_438[2] = '\0';
  local_438[3] = '\0';
  local_438[4] = '\0';
  uVar1 = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
  context->slavelist[slave].mbx_cnt = uVar1;
  local_433 = uVar1 << 4 | 3;
  local_432[0] = '\0';
  local_432[1] = 0x80;
  local_432[2] = '\x03';
  local_432[3] = '\0';
  local_432[4] = '\0';
  local_432[5] = '\0';
  local_42c = pODlist->Index[uVar4];
  iVar2 = ecx_mbxsend(context,slave,(ec_mbxbuft *)local_438,20000);
  if (0 < iVar2) {
    ec_clearmbx((ec_mbxbuft *)&local_838);
    iVar2 = ecx_mbxreceive(context,slave,(ec_mbxbuft *)&local_838,700000);
    if (0 < iVar2) {
      if (((local_833 & 0xf) == 3) && ((local_830 & 0x7f) == 4)) {
        uVar3 = 0x28;
        if ((ushort)(local_838 - 0xcU) < 0x28) {
          uVar3 = local_838 - 0xcU;
        }
        pODlist->DataType[uVar4] = local_82c._2_2_;
        pODlist->ObjectCode[uVar4] = local_827;
        pODlist->MaxSub[uVar4] = local_828;
        strncpy(pODlist->Name[uVar4],local_826,(ulong)(uVar3 & 0xffff));
        pODlist->Name[uVar4][uVar3 & 0xffff] = '\0';
      }
      else {
        local_854.Index = pODlist->Index[uVar4];
        if ((local_830 & 0x7f) == 7) {
          local_854.SubIdx = '\0';
          *context->ecaterror = '\x01';
          local_854.Etype = EC_ERR_TYPE_SDOINFO_ERROR;
          local_854.field_6.AbortCode = local_82c;
          local_854.Slave = slave;
          ecx_pusherror(context,&local_854);
          iVar2 = 0;
        }
        else {
          iVar2 = 0;
          ecx_packeterror(context,slave,local_854.Index,'\0',1);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ecx_readODdescription(ecx_contextt *context, uint16 Item, ec_ODlistt *pODlist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   int wkc;
   uint16  n, Slave;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;

   Slave = pODlist->Slave;
   pODlist->DataType[Item] = 0;
   pODlist->ObjectCode[Item] = 0;
   pODlist->MaxSub[Item] = 0;
   pODlist->Name[Item][0] = 0;
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x0008);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_OD_REQ; /* get object description request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0; /* fragments left */
   SDOp->wdata[0] = htoes(pODlist->Index[Item]); /* Data of Index */
   /* send get object description request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      ec_clearmbx(&MbxIn);
      /* read slave response */
      wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
      /* got response ? */
      if (wkc > 0)
      {
         if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
             ((aSDOp->Opcode & 0x7f) == ECT_GET_OD_RES))
         {
            n = (etohs(aSDOp->MbxHeader.length) - 12); /* length of string(name of object) */
            if (n > EC_MAXNAME)
            {
               n = EC_MAXNAME; /* max chars */
            }
            pODlist->DataType[Item] = etohs(aSDOp->wdata[1]);
            pODlist->ObjectCode[Item] = aSDOp->bdata[5];
            pODlist->MaxSub[Item] = aSDOp->bdata[4];

            strncpy(pODlist->Name[Item] , (char *)&aSDOp->bdata[6], n);
            pODlist->Name[Item][n] = 0x00; /* String terminator */
         }
         /* got unexpected response from slave */
         else
         {
            if (((aSDOp->Opcode & 0x7f) == ECT_SDOINFO_ERROR)) /* SDO info error received */
            {
               ecx_SDOinfoerror(context, Slave,pODlist->Index[Item], 0, etohl(aSDOp->ldata[0]));
            }
            else
            {
               ecx_packeterror(context, Slave,pODlist->Index[Item], 0, 1); /* Unexpected frame returned */
            }
            wkc = 0;
         }
      }
   }
  
   return wkc;
}